

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O0

hugeint_t duckdb::UUID::GenerateRandomUUID(RandomEngine *engine)

{
  uint32_t uVar1;
  pointer pvVar2;
  byte *pbVar3;
  hugeint_t hVar4;
  int i;
  array<unsigned_char,_16UL> bytes;
  size_type __n;
  array<unsigned_char,_16UL> *in_stack_ffffffffffffffc0;
  array<unsigned_char,_16UL> *this;
  int local_2c;
  
  for (local_2c = 0; local_2c < 0x10; local_2c = local_2c + 4) {
    uVar1 = RandomEngine::NextRandomInteger((RandomEngine *)0x3c10c2);
    pvVar2 = ::std::array<unsigned_char,_16UL>::data((array<unsigned_char,_16UL> *)0x3c10d0);
    *(uint32_t *)(pvVar2 + local_2c) = uVar1;
  }
  __n = 8;
  pbVar3 = ::std::array<unsigned_char,_16UL>::operator[](in_stack_ffffffffffffffc0,8);
  *pbVar3 = *pbVar3 & 0xbf;
  pbVar3 = ::std::array<unsigned_char,_16UL>::operator[](in_stack_ffffffffffffffc0,__n);
  *pbVar3 = *pbVar3 | 0x80;
  this = (array<unsigned_char,_16UL> *)0x6;
  pbVar3 = ::std::array<unsigned_char,_16UL>::operator[]((array<unsigned_char,_16UL> *)0x6,__n);
  *pbVar3 = *pbVar3 & 0x4f;
  pbVar3 = ::std::array<unsigned_char,_16UL>::operator[](this,__n);
  *pbVar3 = *pbVar3 | 0x40;
  hVar4 = BaseUUID::Convert((array<unsigned_char,_16UL> *)0x3c1158);
  return hVar4;
}

Assistant:

hugeint_t UUIDv4::GenerateRandomUUID(RandomEngine &engine) {
	std::array<uint8_t, 16> bytes;
	for (int i = 0; i < 16; i += 4) {
		*reinterpret_cast<uint32_t *>(bytes.data() + i) = engine.NextRandomInteger();
	}
	// variant must be 10xxxxxx
	bytes[8] &= 0xBF;
	bytes[8] |= 0x80;
	// version must be 0100xxxx
	bytes[6] &= 0x4F;
	bytes[6] |= 0x40;

	return Convert(bytes);
}